

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

TidyMessageImpl *
formatDialogue(TidyDocImpl *doc,uint code,TidyReportLevel level,__va_list_tag *args)

{
  uint uVar1;
  uint quantity;
  undefined8 *puVar2;
  ctmbstr ptVar3;
  ctmbstr ptVar4;
  TidyMessageImpl *pTVar5;
  
  if ((int)code < 0x21b) {
    if ((code == 0x212) || (code == 0x219)) {
      uVar1 = args->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        puVar2 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        puVar2 = (undefined8 *)args->overflow_arg_area;
        args->overflow_arg_area = puVar2 + 1;
      }
      pTVar5 = prvTidytidyMessageCreate(doc,code,level,*puVar2);
      return pTVar5;
    }
  }
  else if ((code == 0x21b) || (code == 0x21e)) {
    uVar1 = doc->warnings;
    ptVar3 = tidyLocalizedStringN(0x1f9,uVar1);
    quantity = doc->errors;
    ptVar4 = tidyLocalizedStringN(0x1f8,quantity);
    pTVar5 = prvTidytidyMessageCreate(doc,code,level,(ulong)uVar1,ptVar3,(ulong)quantity,ptVar4);
    return pTVar5;
  }
  pTVar5 = prvTidytidyMessageCreate(doc,code,level);
  return pTVar5;
}

Assistant:

TidyMessageImpl *formatDialogue( TidyDocImpl* doc, uint code, TidyReportLevel level, va_list args )
{
    switch (code)
    {
        case TEXT_SGML_CHARS:
        case TEXT_VENDOR_CHARS:
        {
            ctmbstr str = va_arg(args, ctmbstr);
            return TY_(tidyMessageCreate)( doc, code, level, str );
        }
            
        case STRING_ERROR_COUNT:
        case STRING_NOT_ALL_SHOWN:
            return TY_(tidyMessageCreate)( doc, code, level,
                                           doc->warnings, tidyLocalizedStringN( STRING_ERROR_COUNT_WARNING, doc->warnings ),
                                           doc->errors, tidyLocalizedStringN( STRING_ERROR_COUNT_ERROR, doc->errors ) );

        case FOOTNOTE_TRIM_EMPTY_ELEMENT:
        case STRING_HELLO_ACCESS:
        case STRING_NEEDS_INTERVENTION:
        case STRING_NO_ERRORS:
        case TEXT_ACCESS_ADVICE1:
        case TEXT_ACCESS_ADVICE2:
        case TEXT_BAD_FORM:
        case TEXT_BAD_MAIN:
        case TEXT_GENERAL_INFO:
        case TEXT_GENERAL_INFO_PLEA:
        case TEXT_HTML_T_ALGORITHM:
        case TEXT_INVALID_URI:
        case TEXT_INVALID_UTF8:
        case TEXT_INVALID_UTF16:
        case TEXT_M_IMAGE_ALT:
        case TEXT_M_IMAGE_MAP:
        case TEXT_M_LINK_ALT:
        case TEXT_M_SUMMARY:
        case TEXT_USING_BODY:
        case TEXT_USING_FONT:
        case TEXT_USING_FRAMES:
        case TEXT_USING_LAYER:
        case TEXT_USING_NOBR:
        case TEXT_USING_SPACER:
        default:
            return TY_(tidyMessageCreate)( doc, code, level );
    }
    
    return NULL;
}